

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_pop<int,false,6>(immutable *this,ref<immutable::rrb<int,_false,_6>_> *in)

{
  rrb<int,_false,_6> *prVar1;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_18;
  
  prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  if (prVar1->cnt == 1) {
    rrb_create<int,false,6>();
  }
  else {
    prVar1 = rrb_details::rrb_head_clone<int,false,6>(in->ptr);
    *(rrb<int,_false,_6> **)this = prVar1;
    if (prVar1 != (rrb<int,_false,_6> *)0x0) {
      prVar1->_ref_count = 1;
    }
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->
                       ((ref<immutable::rrb<int,_false,_6>_> *)this);
    prVar1->cnt = prVar1->cnt - 1;
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    if (prVar1->tail_len == 1) {
      rrb_details::promote_rightmost_leaf<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)this);
    }
    else {
      prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      local_18.ptr = rrb_details::leaf_node_dec<int,false>((prVar1->tail).ptr);
      if (local_18.ptr != (leaf_node<int,_false> *)0x0) {
        (local_18.ptr)->_ref_count = 1;
      }
      prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)this);
      prVar1->tail_len = prVar1->tail_len - 1;
      prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)this);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar1->tail,&local_18);
      rrb_details::release<int>(local_18.ptr);
    }
  }
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_pop(const ref<rrb<T, atomic_ref_counting, N>>& in)
    {
    using namespace rrb_details;
    if (in->cnt == 1)
      {
      return rrb_create<T, atomic_ref_counting, N>();
      }
    ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
    new_rrb->cnt--;

    if (in->tail_len == 1)
      {
      promote_rightmost_leaf(new_rrb);
      return new_rrb;
      }
    else
      {
      ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_dec(in->tail.ptr);
      new_rrb->tail_len--;
      new_rrb->tail = new_tail;
      return new_rrb;
      }
    }